

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry_&> __thiscall
kj::
Table<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Entry,kj::HashIndex<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>>
::find<0ul,kj::PathPtr&>
          (Table<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Entry,kj::HashIndex<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>>
           *this,PathPtr *params)

{
  String *pSVar1;
  ArrayPtr<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry> table;
  HashIndex<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>
  local_28 [8];
  long local_20;
  
  table.ptr = (Entry *)(params + 2);
  pSVar1 = (params->parts).ptr;
  table.size_ = (size_t)pSVar1;
  HashIndex<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>::
  find<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Entry,kj::PathPtr&>
            (local_28,table,(PathPtr *)((long)((params->parts).size_ - (long)pSVar1) / 0x30));
  if (local_28[0] ==
      (HashIndex<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>)
      0x1) {
    pSVar1 = (params->parts).ptr + local_20 * 2;
  }
  else {
    pSVar1 = (String *)0x0;
  }
  *(String **)this = pSVar1;
  return (Maybe<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry_&>)
         (Entry *)this;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}